

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_strategy.cpp
# Opt level: O2

void __thiscall
EscapeStrategy::generateActions(EscapeStrategy *this,PlayerSight *sight,Actions *actions)

{
  Vec2 pos;
  bool bVar1;
  Randomizer *this_00;
  Router *this_01;
  long lVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_50;
  Vec2 local_38;
  
  if (this->field_0xc != '\0') {
    return;
  }
  local_38 = sight->pos;
  local_50 = 0.0;
  iVar3 = 0;
  do {
    if (this->tries <= iVar3) {
      Actions::emplace(actions,SelectDestination,sight->id,local_38);
      return;
    }
    do {
      this_00 = Randomizer::getInstance();
      fVar4 = Randomizer::randXAxis(this_00);
      fVar6 = (fVar4 * 3.1415927) / 60.0 + 3.1415927;
      fVar4 = cosf(fVar6);
      fVar5 = sinf(fVar6);
      fVar6 = (sight->pos).x + fVar4 + fVar4;
      fVar4 = (sight->pos).y + fVar5 + fVar5;
      this_01 = Router::getInstance();
      pos.y = fVar4;
      pos.x = fVar6;
      bVar1 = Router::Reachable(this_01,pos);
    } while (bVar1);
    fVar5 = 0.0;
    for (lVar2 = *(long *)&sight->unitInSight; lVar2 != *(long *)&sight->field_0x80;
        lVar2 = lVar2 + 0x14) {
      fVar7 = *(float *)(lVar2 + 4) - (sight->pos).x;
      fVar8 = *(float *)(lVar2 + 8) - (sight->pos).y;
      fVar7 = SQRT(fVar7 * fVar7 + fVar8 * fVar8);
      if (fVar7 < 0.0001) {
        fVar5 = 1e+08;
        break;
      }
      fVar5 = fVar5 + 1.0 / fVar7;
    }
    if (local_50 <= fVar5) {
      fVar5 = local_50;
      fVar4 = local_38.y;
      fVar6 = local_38.x;
    }
    iVar3 = iVar3 + 1;
    local_38.y = fVar4;
    local_38.x = fVar6;
    local_50 = fVar5;
  } while( true );
}

Assistant:

void EscapeStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    Vec2 best(sight.pos);
    float best_score = 0;
    for (int i = 0; i < tries; ++i)
    {
        Vec2 goal;
        do          //使用Randomizer的AxisRnd，通过变换生成一个均匀分布在(0, 2π)的随机角度
        {
            float rad = (Randomizer::getInstance()->randXAxis()) * PI / MapWidth + PI;
            Vec2 e0(cos(rad), sin(rad));
            goal = sight.pos + e0 * PlayerVelocity;
        } while (Router::getInstance()->Reachable(goal));
        float score = 0;
        for (auto uinfo : sight.unitInSight)
        {
            float dis = (uinfo.pos - sight.pos).length();
            if (dis < EPS)
            {
                score = FINF;
                break;
            }
            score += 1 / dis;
        }
        if (score < best_score)
        {
            best_score = score;
            best = goal;
        }
    }
    actions->emplace(SelectDestination, sight.id, best);
}